

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector2 Vector2Normalize(Vector2 v)

{
  Vector2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar2 = v.x;
  fVar4 = v.y;
  fVar3 = fVar2 * fVar2 + fVar4 * fVar4;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  if (0.0 < fVar3) {
    fVar5 = fVar2 * (1.0 / fVar3);
    fVar6 = (1.0 / fVar3) * fVar4;
  }
  VVar1.y = fVar6;
  VVar1.x = fVar5;
  return VVar1;
}

Assistant:

RMAPI Vector2 Vector2Normalize(Vector2 v)
{
    Vector2 result = { 0 };
    float length = sqrtf((v.x*v.x) + (v.y*v.y));

    if (length > 0)
    {
        float ilength = 1.0f/length;
        result.x = v.x*ilength;
        result.y = v.y*ilength;
    }

    return result;
}